

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

bool __thiscall despot::util::tinyxml::TiXmlDocument::SaveFile(TiXmlDocument *this,char *filename)

{
  bool bVar1;
  FILE *__stream;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = SaveFile(this,(FILE *)__stream);
    fclose(__stream);
  }
  return bVar1;
}

Assistant:

bool TiXmlDocument::SaveFile(const char * filename) const {
	// The old c stuff lives on...
	FILE* fp = TiXmlFOpen(filename, "w");
	if (fp) {
		bool result = SaveFile(fp);
		fclose(fp);
		return result;
	}
	return false;
}